

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

void __thiscall
Diligent::GetTexViewTypeLiteralName::TexViewTypeToLiteralNameMap::TexViewTypeToLiteralNameMap
          (TexViewTypeToLiteralNameMap *this)

{
  reference ppcVar1;
  TexViewTypeToLiteralNameMap *this_local;
  
  memset(this,0,0x38);
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,0);
  *ppcVar1 = "TEXTURE_VIEW_UNDEFINED";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,1);
  *ppcVar1 = "TEXTURE_VIEW_SHADER_RESOURCE";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,2);
  *ppcVar1 = "TEXTURE_VIEW_RENDER_TARGET";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,3);
  *ppcVar1 = "TEXTURE_VIEW_DEPTH_STENCIL";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,4);
  *ppcVar1 = "TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,5);
  *ppcVar1 = "TEXTURE_VIEW_UNORDERED_ACCESS";
  ppcVar1 = std::array<const_char_*,_7UL>::operator[](&this->TexViewLiteralNames,6);
  *ppcVar1 = "TEXTURE_VIEW_SHADING_RATE";
  return;
}

Assistant:

TexViewTypeToLiteralNameMap()
        {
#define INIT_TEX_VIEW_TYPE_NAME(ViewType) TexViewLiteralNames[ViewType] = #ViewType
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNDEFINED);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADER_RESOURCE);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_RENDER_TARGET);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_UNORDERED_ACCESS);
            INIT_TEX_VIEW_TYPE_NAME(TEXTURE_VIEW_SHADING_RATE);
#undef INIT_TEX_VIEW_TYPE_NAME
            static_assert(TEXTURE_VIEW_NUM_VIEWS == 7, "Not all texture views names are initialized.");
        }